

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solvers.cpp
# Opt level: O0

vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_> *
getPredefinedTransformations1L1Q1P<float>
          (vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
           *__return_storage_ptr__,Matrix<float,_4,_1,_0,_4,_1> *P1,
          Matrix<float,_4,_1,_0,_4,_1> *P1_B,Matrix<float,_4,_1,_0,_4,_1> *Pi,
          Matrix<float,_4,_1,_0,_4,_1> *Pi_B)

{
  DenseBase<Eigen::Matrix<float,4,4,0,4,4>> *this;
  MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *other;
  Scalar *pSVar1;
  Scalar *pSVar2;
  ReturnType_conflict RVar3;
  RealScalar RVar4;
  RealScalar RVar5;
  Product<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_0> local_ae8;
  Product<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_0> local_ad8;
  undefined1 local_ac8 [8];
  Matrix<float,_4,_4,_0,_4,_4> TP_B;
  undefined1 local_a78 [8];
  Matrix<float,_4,_4,_0,_4,_4> TP;
  Block<Eigen::Matrix<float,4,4,0,4,4>,_1,_1,false> local_a30 [56];
  non_const_type local_9f8;
  Block<Eigen::Matrix<float,4,4,0,4,4>,_1,_1,false> local_9f0 [60];
  MatrixBase<Eigen::Matrix<float,3,1,0,3,1>> local_9b4 [12];
  non_const_type local_9a8;
  Block<Eigen::Matrix<float,4,4,0,4,4>,_1,_1,false> local_9a0 [56];
  non_const_type local_968;
  Matrix<float,_3,_1,_0,_3,_1> local_960;
  Matrix<float,_3,_1,_0,_3,_1> local_954;
  Matrix<float,_3,_1,_0,_3,_1> local_948;
  Matrix<float,_3,_1,_0,_3,_1> local_93c;
  Type local_930;
  PlainObject local_8f8;
  Type local_8d0;
  non_const_type local_898;
  Type local_890;
  MatrixBase<Eigen::Matrix<float,3,1,0,3,1>> local_854 [12];
  non_const_type local_848;
  Type local_840;
  non_const_type local_808;
  Matrix<float,_3,_1,_0,_3,_1> local_800;
  Matrix<float,_3,_1,_0,_3,_1> local_7f4;
  Matrix<float,_3,_1,_0,_3,_1> local_7e8;
  Matrix<float,_3,_1,_0,_3,_1> local_7dc;
  Type local_7d0;
  PlainObject local_798;
  undefined1 local_774 [8];
  Matrix<float,_3,_1,_0,_3,_1> t2;
  Matrix<float,_3,_1,_0,_3,_1> t1;
  Matrix<float,_3,_1,_0,_3,_1> v1_;
  Matrix<float,_3,_1,_0,_3,_1> v1;
  Matrix<float,_3,_1,_0,_3,_1> v3;
  Matrix<float,_4,_4,_0,_4,_4> transV_B;
  Matrix<float,_4,_4,_0,_4,_4> transV;
  XprTypeNested local_6b0;
  Product<Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>,_0>
  local_6a8;
  non_const_type local_698;
  XprTypeNested local_690;
  Product<Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>,_0>
  local_688;
  undefined1 local_678 [8];
  Matrix<float,_4,_1,_0,_4,_1> Pi_B1;
  Matrix<float,_4,_1,_0,_4,_1> Pi_1;
  Type local_620;
  NegativeReturnType local_5e8;
  Type local_5a8;
  Type local_570;
  NegativeReturnType local_538;
  undefined1 local_4f8 [8];
  Matrix<float,_4,_4,_0,_4,_4> transU_B;
  Matrix<float,_4,_4,_0,_4,_4> transU;
  Type local_440;
  Type local_408;
  Type local_3d0;
  float local_394;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,_4,_1>_>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>_>
  local_390;
  Type local_338;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,_4,_1>_>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>_>_>
  local_300;
  Type local_268;
  Type local_230;
  Type local_1f8;
  Type local_1c0;
  float local_184;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,_4,_1>_>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>_>
  local_180;
  Type local_128;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,_4,_1>_>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>_>_>
  local_f0;
  undefined1 local_58 [8];
  Matrix<float,_4,_1,_0,_4,_1> P1_pi_B;
  Matrix<float,_4,_1,_0,_4,_1> P1_pi;
  Matrix<float,_4,_1,_0,_4,_1> *Pi_B_local;
  Matrix<float,_4,_1,_0,_4,_1> *Pi_local;
  Matrix<float,_4,_1,_0,_4,_1> *P1_B_local;
  Matrix<float,_4,_1,_0,_4,_1> *P1_local;
  vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
  *out;
  
  Eigen::Matrix<float,_4,_1,_0,_4,_1>::Matrix
            ((Matrix<float,_4,_1,_0,_4,_1> *)
             (P1_pi_B.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.
              array + 2));
  Eigen::Matrix<float,_4,_1,_0,_4,_1>::Matrix((Matrix<float,_4,_1,_0,_4,_1> *)local_58);
  Eigen::DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>::head<int>
            (&local_128,(DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)P1,3);
  Eigen::DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>::head<int>
            (&local_1c0,(DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)P1,3);
  Eigen::DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>::head<int>
            (&local_1f8,(DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)Pi,3);
  RVar3 = Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,-1,1,false>>::
          dot<Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,_1,1,false>>
                    ((MatrixBase<Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,_1,1,false>> *)
                     &local_1c0,
                     (MatrixBase<Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>_> *
                     )&local_1f8);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1> *)Pi,3);
  local_184 = RVar3 + *pSVar1;
  Eigen::DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>::head<int>
            (&local_230,(DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)Pi,3);
  Eigen::operator*(&local_180,&local_184,(StorageBaseType *)&local_230);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,-1,1,false>>::operator-
            (&local_f0,
             (MatrixBase<Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,_1,1,false>> *)&local_128,
             (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,_4,_1>_>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>_>_>
              *)&local_180);
  Eigen::DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>::head<int>
            (&local_268,
             (DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)
             (P1_pi_B.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.
              array + 2),3);
  Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,-1,1,false>::operator=
            ((Block<Eigen::Matrix<float,4,1,0,4,1>,_1,1,false> *)&local_268,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,_4,_1>_>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>_>_>_>
              *)&local_f0);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1> *)
                      (P1_pi_B.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage
                       .m_data.array + 2),3);
  *pSVar1 = 1.0;
  Eigen::DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>::head<int>
            (&local_338,(DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)P1_B,3);
  Eigen::DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>::head<int>
            (&local_3d0,(DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)P1_B,3);
  Eigen::DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>::head<int>
            (&local_408,(DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)Pi_B,3);
  RVar3 = Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,-1,1,false>>::
          dot<Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,_1,1,false>>
                    ((MatrixBase<Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,_1,1,false>> *)
                     &local_3d0,
                     (MatrixBase<Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>_> *
                     )&local_408);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1> *)Pi_B,3);
  local_394 = RVar3 + *pSVar1;
  Eigen::DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>::head<int>
            (&local_440,(DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)Pi_B,3);
  Eigen::operator*(&local_390,&local_394,(StorageBaseType *)&local_440);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,-1,1,false>>::operator-
            (&local_300,
             (MatrixBase<Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,_1,1,false>> *)&local_338,
             (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,_4,_1>_>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>_>_>
              *)&local_390);
  Eigen::DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>::head<int>
            ((Type *)(transU.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                      m_data.array + 0xe),
             (DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)local_58,3);
  Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,-1,1,false>::operator=
            ((Block<Eigen::Matrix<float,4,1,0,4,1>,_1,1,false> *)
             (transU.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.
              array + 0xe),
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,_4,_1>_>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>_>_>_>
              *)&local_300);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1> *)local_58,3);
  *pSVar1 = 1.0;
  Eigen::Matrix<float,_4,_4,_0,_4,_4>::Matrix
            ((Matrix<float,_4,_4,_0,_4,_4> *)
             (transU_B.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.
              array + 0xe));
  Eigen::Matrix<float,_4,_4,_0,_4,_4>::Matrix((Matrix<float,_4,_4,_0,_4,_4> *)local_4f8);
  Eigen::MatrixBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::setIdentity
            ((MatrixBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> *)
             (transU_B.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.
              array + 0xe),4,4);
  Eigen::DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>::head<int>
            (&local_570,
             (DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)
             (P1_pi_B.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.
              array + 2),3);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_-1,_1,_false>_>::operator-
            (&local_538,
             (DenseBase<Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>_> *)
             &local_570);
  Eigen::DenseBase<Eigen::Matrix<float,4,4,0,4,4>>::topRightCorner<int,int>
            (&local_5a8,
             (DenseBase<Eigen::Matrix<float,4,4,0,4,4>> *)
             (transU_B.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.
              array + 0xe),3,1);
  Eigen::Block<Eigen::Matrix<float,4,4,0,4,4>,-1,-1,false>::operator=
            ((Block<Eigen::Matrix<float,4,4,0,4,4>,_1,_1,false> *)&local_5a8,
             (DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>_>_>
              *)&local_538);
  Eigen::MatrixBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::setIdentity
            ((MatrixBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> *)local_4f8,4,4);
  Eigen::DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>::head<int>
            (&local_620,(DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)local_58,3);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_-1,_1,_false>_>::operator-
            (&local_5e8,
             (DenseBase<Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>_> *)
             &local_620);
  Eigen::DenseBase<Eigen::Matrix<float,4,4,0,4,4>>::topRightCorner<int,int>
            ((Type *)(Pi_1.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.
                      m_data.array + 2),(DenseBase<Eigen::Matrix<float,4,4,0,4,4>> *)local_4f8,3,1);
  Eigen::Block<Eigen::Matrix<float,4,4,0,4,4>,-1,-1,false>::operator=
            ((Block<Eigen::Matrix<float,4,4,0,4,4>,_1,_1,false> *)
             (Pi_1.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.
              array + 2),
             (DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,_const_Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>_>_>
              *)&local_5e8);
  Eigen::Matrix<float,_4,_1,_0,_4,_1>::Matrix
            ((Matrix<float,_4,_1,_0,_4,_1> *)
             (Pi_B1.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.
              array + 2));
  Eigen::Matrix<float,_4,_1,_0,_4,_1>::Matrix((Matrix<float,_4,_1,_0,_4,_1> *)local_678);
  local_698 = (non_const_type)
              Eigen::DenseBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::transpose
                        ((DenseBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> *)
                         (transU_B.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                          m_storage.m_data.array + 0xe));
  local_690.m_matrix =
       (non_const_type)
       Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>::inverse
                 ((MatrixBase<Eigen::Transpose<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_> *)&local_698)
  ;
  local_688 = Eigen::MatrixBase<Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<float,4,4,0,4,4>>>>::
              operator*((MatrixBase<Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<float,4,4,0,4,4>>>>
                         *)&local_690,(MatrixBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)Pi);
  Eigen::Matrix<float,4,1,0,4,1>::operator=
            ((Matrix<float,4,1,0,4,1> *)
             (Pi_B1.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.
              array + 2),
             (DenseBase<Eigen::Product<Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>,_0>_>
              *)&local_688);
  transV.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array._56_8_ =
       Eigen::DenseBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::transpose
                 ((DenseBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> *)local_4f8);
  local_6b0.m_matrix =
       (non_const_type)
       Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>::inverse
                 ((MatrixBase<Eigen::Transpose<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_> *)
                  (transV.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                   m_data.array + 0xe));
  local_6a8 = Eigen::MatrixBase<Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<float,4,4,0,4,4>>>>::
              operator*((MatrixBase<Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<float,4,4,0,4,4>>>>
                         *)&local_6b0,(MatrixBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)Pi_B);
  Eigen::Matrix<float,4,1,0,4,1>::operator=
            ((Matrix<float,4,1,0,4,1> *)local_678,
             (DenseBase<Eigen::Product<Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>,_0>_>
              *)&local_6a8);
  Eigen::Matrix<float,_4,_4,_0,_4,_4>::Matrix
            ((Matrix<float,_4,_4,_0,_4,_4> *)
             (transV_B.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.
              array + 0xe));
  Eigen::Matrix<float,_4,_4,_0,_4,_4>::Matrix
            ((Matrix<float,_4,_4,_0,_4,_4> *)
             (v3.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
             + 1));
  Eigen::MatrixBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::setIdentity
            ((MatrixBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> *)
             (transV_B.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.
              array + 0xe),4,4);
  Eigen::MatrixBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::setIdentity
            ((MatrixBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> *)
             (v3.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
             + 1),4,4);
  Eigen::Matrix<float,_3,_1,_0,_3,_1>::Matrix
            ((Matrix<float,_3,_1,_0,_3,_1> *)
             (v1.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
             + 1));
  Eigen::Matrix<float,_3,_1,_0,_3,_1>::Matrix
            ((Matrix<float,_3,_1,_0,_3,_1> *)
             (v1_.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
             + 1));
  Eigen::Matrix<float,_3,_1,_0,_3,_1>::Matrix
            ((Matrix<float,_3,_1,_0,_3,_1> *)
             (t1.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
             + 1));
  Eigen::Matrix<float,_3,_1,_0,_3,_1>::Matrix
            ((Matrix<float,_3,_1,_0,_3,_1> *)
             (t2.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
             + 1));
  Eigen::Matrix<float,_3,_1,_0,_3,_1>::Matrix((Matrix<float,_3,_1,_0,_3,_1> *)local_774);
  Eigen::DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::setZero
            ((DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)
             (t2.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
             + 1));
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_1> *)
                      (t2.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
                       m_data.array + 1),0);
  *pSVar2 = 1.0;
  Eigen::DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::setZero
            ((DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)local_774);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_1> *)local_774,1);
  *pSVar2 = 1.0;
  Eigen::DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>::head<int>
            (&local_7d0,
             (DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)
             (Pi_B1.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.
              array + 2),3);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_-1,_1,_false>_>::normalized
            (&local_798,
             (MatrixBase<Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>_> *)
             &local_7d0);
  Eigen::Matrix<float,3,1,0,3,1>::operator=
            ((Matrix<float,3,1,0,3,1> *)
             (v1.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
             + 1),(DenseBase<Eigen::Matrix<float,__1,_1,_0,_4,_1>_> *)&local_798);
  Eigen::MatrixBase<Eigen::Matrix<float,3,1,0,3,1>>::cross<Eigen::Matrix<float,3,1,0,3,1>>
            ((MatrixBase<Eigen::Matrix<float,3,1,0,3,1>> *)&local_7dc,
             (MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)
             (t2.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
             + 1));
  Eigen::Matrix<float,_3,_1,_0,_3,_1>::operator=
            ((Matrix<float,_3,_1,_0,_3,_1> *)
             (v1_.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
             + 1),&local_7dc);
  Eigen::MatrixBase<Eigen::Matrix<float,3,1,0,3,1>>::cross<Eigen::Matrix<float,3,1,0,3,1>>
            ((MatrixBase<Eigen::Matrix<float,3,1,0,3,1>> *)&local_7e8,
             (MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)local_774);
  Eigen::Matrix<float,_3,_1,_0,_3,_1>::operator=
            ((Matrix<float,_3,_1,_0,_3,_1> *)
             (t1.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
             + 1),&local_7e8);
  RVar4 = Eigen::MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::norm
                    ((MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)
                     (v1_.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
                      m_data.array + 1));
  RVar5 = Eigen::MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::norm
                    ((MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)
                     (t1.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
                      m_data.array + 1));
  if (RVar4 < RVar5) {
    Eigen::MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::normalized
              ((MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)&local_800);
    Eigen::Matrix<float,_3,_1,_0,_3,_1>::operator=
              ((Matrix<float,_3,_1,_0,_3,_1> *)
               (v1_.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                array + 1),&local_800);
  }
  else {
    Eigen::MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::normalized
              ((MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)&local_7f4);
    Eigen::Matrix<float,_3,_1,_0,_3,_1>::operator=
              ((Matrix<float,_3,_1,_0,_3,_1> *)
               (v1_.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                array + 1),&local_7f4);
  }
  local_808 = (non_const_type)
              Eigen::DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::transpose
                        ((DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)
                         (v1_.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
                          m_data.array + 1));
  Eigen::DenseBase<Eigen::Matrix<float,4,4,0,4,4>>::topLeftCorner<int,int>
            (&local_840,
             (DenseBase<Eigen::Matrix<float,4,4,0,4,4>> *)
             (transV_B.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.
              array + 0xe),1,3);
  Eigen::Block<Eigen::Matrix<float,4,4,0,4,4>,-1,-1,false>::operator=
            ((Block<Eigen::Matrix<float,4,4,0,4,4>,_1,_1,false> *)&local_840,
             (DenseBase<Eigen::Transpose<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_> *)&local_808);
  Eigen::MatrixBase<Eigen::Matrix<float,3,1,0,3,1>>::cross<Eigen::Matrix<float,3,1,0,3,1>>
            (local_854,
             (MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)
             (v1.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
             + 1));
  local_848 = (non_const_type)
              Eigen::DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::transpose
                        ((DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)local_854);
  Eigen::DenseBase<Eigen::Matrix<float,4,4,0,4,4>>::block<int,int>
            (&local_890,
             (DenseBase<Eigen::Matrix<float,4,4,0,4,4>> *)
             (transV_B.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.
              array + 0xe),1,0,1,3);
  Eigen::Block<Eigen::Matrix<float,4,4,0,4,4>,-1,-1,false>::operator=
            ((Block<Eigen::Matrix<float,4,4,0,4,4>,_1,_1,false> *)&local_890,
             (DenseBase<Eigen::Transpose<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_> *)&local_848);
  local_898 = (non_const_type)
              Eigen::DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::transpose
                        ((DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)
                         (v1.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
                          m_data.array + 1));
  Eigen::DenseBase<Eigen::Matrix<float,4,4,0,4,4>>::block<int,int>
            (&local_8d0,
             (DenseBase<Eigen::Matrix<float,4,4,0,4,4>> *)
             (transV_B.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.
              array + 0xe),2,0,1,3);
  Eigen::Block<Eigen::Matrix<float,4,4,0,4,4>,-1,-1,false>::operator=
            ((Block<Eigen::Matrix<float,4,4,0,4,4>,_1,_1,false> *)&local_8d0,
             (DenseBase<Eigen::Transpose<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_> *)&local_898);
  Eigen::DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>::head<int>
            (&local_930,(DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)local_678,3);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_-1,_1,_false>_>::normalized
            (&local_8f8,
             (MatrixBase<Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>_> *)
             &local_930);
  Eigen::Matrix<float,3,1,0,3,1>::operator=
            ((Matrix<float,3,1,0,3,1> *)
             (v1.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
             + 1),(DenseBase<Eigen::Matrix<float,__1,_1,_0,_4,_1>_> *)&local_8f8);
  Eigen::MatrixBase<Eigen::Matrix<float,3,1,0,3,1>>::cross<Eigen::Matrix<float,3,1,0,3,1>>
            ((MatrixBase<Eigen::Matrix<float,3,1,0,3,1>> *)&local_93c,
             (MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)
             (t2.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
             + 1));
  Eigen::Matrix<float,_3,_1,_0,_3,_1>::operator=
            ((Matrix<float,_3,_1,_0,_3,_1> *)
             (v1_.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
             + 1),&local_93c);
  Eigen::MatrixBase<Eigen::Matrix<float,3,1,0,3,1>>::cross<Eigen::Matrix<float,3,1,0,3,1>>
            ((MatrixBase<Eigen::Matrix<float,3,1,0,3,1>> *)&local_948,
             (MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)local_774);
  Eigen::Matrix<float,_3,_1,_0,_3,_1>::operator=
            ((Matrix<float,_3,_1,_0,_3,_1> *)
             (t1.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
             + 1),&local_948);
  RVar4 = Eigen::MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::norm
                    ((MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)
                     (v1_.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
                      m_data.array + 1));
  RVar5 = Eigen::MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::norm
                    ((MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)
                     (t1.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
                      m_data.array + 1));
  if (RVar4 < RVar5) {
    Eigen::MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::normalized
              ((MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)&local_960);
    Eigen::Matrix<float,_3,_1,_0,_3,_1>::operator=
              ((Matrix<float,_3,_1,_0,_3,_1> *)
               (v1_.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                array + 1),&local_960);
  }
  else {
    Eigen::MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::normalized
              ((MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)&local_954);
    Eigen::Matrix<float,_3,_1,_0,_3,_1>::operator=
              ((Matrix<float,_3,_1,_0,_3,_1> *)
               (v1_.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                array + 1),&local_954);
  }
  local_968 = (non_const_type)
              Eigen::DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::transpose
                        ((DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)
                         (v1_.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
                          m_data.array + 1));
  this = (DenseBase<Eigen::Matrix<float,4,4,0,4,4>> *)
         (v3.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array + 1)
  ;
  Eigen::DenseBase<Eigen::Matrix<float,4,4,0,4,4>>::topLeftCorner<int,int>
            ((Type *)local_9a0,this,1,3);
  Eigen::Block<Eigen::Matrix<float,4,4,0,4,4>,-1,-1,false>::operator=
            (local_9a0,
             (DenseBase<Eigen::Transpose<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_> *)&local_968);
  other = (MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)
          (v1.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array + 1
          );
  Eigen::MatrixBase<Eigen::Matrix<float,3,1,0,3,1>>::cross<Eigen::Matrix<float,3,1,0,3,1>>
            (local_9b4,other);
  local_9a8 = (non_const_type)
              Eigen::DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::transpose
                        ((DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)local_9b4);
  Eigen::DenseBase<Eigen::Matrix<float,4,4,0,4,4>>::block<int,int>((Type *)local_9f0,this,1,0,1,3);
  Eigen::Block<Eigen::Matrix<float,4,4,0,4,4>,-1,-1,false>::operator=
            (local_9f0,
             (DenseBase<Eigen::Transpose<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_> *)&local_9a8);
  local_9f8 = (non_const_type)
              Eigen::DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::transpose
                        ((DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)other);
  Eigen::DenseBase<Eigen::Matrix<float,4,4,0,4,4>>::block<int,int>((Type *)local_a30,this,2,0,1,3);
  Eigen::Block<Eigen::Matrix<float,4,4,0,4,4>,-1,-1,false>::operator=
            (local_a30,
             (DenseBase<Eigen::Transpose<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_> *)&local_9f8);
  TP.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0xf]._3_1_ =
       0;
  std::
  vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
  ::vector(__return_storage_ptr__);
  Eigen::Matrix<float,_4,_4,_0,_4,_4>::Matrix((Matrix<float,_4,_4,_0,_4,_4> *)local_a78);
  Eigen::Matrix<float,_4,_4,_0,_4,_4>::Matrix((Matrix<float,_4,_4,_0,_4,_4> *)local_ac8);
  local_ad8 = Eigen::MatrixBase<Eigen::Matrix<float,4,4,0,4,4>>::operator*
                        ((MatrixBase<Eigen::Matrix<float,4,4,0,4,4>> *)
                         (transV_B.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                          m_storage.m_data.array + 0xe),
                         (MatrixBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> *)
                         (transU_B.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                          m_storage.m_data.array + 0xe));
  Eigen::Matrix<float,4,4,0,4,4>::operator=
            ((Matrix<float,4,4,0,4,4> *)local_a78,
             (DenseBase<Eigen::Product<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_0>_>
              *)&local_ad8);
  std::
  vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
  ::push_back(__return_storage_ptr__,(value_type *)local_a78);
  local_ae8 = Eigen::MatrixBase<Eigen::Matrix<float,4,4,0,4,4>>::operator*
                        ((MatrixBase<Eigen::Matrix<float,4,4,0,4,4>> *)
                         (v3.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
                          m_data.array + 1),
                         (MatrixBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> *)local_4f8);
  Eigen::Matrix<float,4,4,0,4,4>::operator=
            ((Matrix<float,4,4,0,4,4> *)local_ac8,
             (DenseBase<Eigen::Product<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_0>_>
              *)&local_ae8);
  std::
  vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
  ::push_back(__return_storage_ptr__,(value_type *)local_ac8);
  return __return_storage_ptr__;
}

Assistant:

vector<Matrix<floatPrec, 4,4>> getPredefinedTransformations1L1Q1P(
	Matrix<floatPrec, 4,1> P1, Matrix<floatPrec, 4,1> P1_B,
	Matrix<floatPrec, 4,1> Pi, Matrix<floatPrec, 4,1> Pi_B)
{

	// project points P1 and P1_B to planes Pi and Pi_B
	Matrix<floatPrec, 4,1> P1_pi, P1_pi_B;
	P1_pi.head(3) = P1.head(3) - (P1.head(3).dot(Pi.head(3)) + Pi(3)) * Pi.head(3);
	P1_pi(3) = 1.0;
	P1_pi_B.head(3) = P1_B.head(3) - (P1_B.head(3).dot(Pi_B.head(3)) + Pi_B(3)) * Pi_B.head(3);
	P1_pi_B(3) = 1.0;

	// translate frames to P1_pi and P1_pi_B
	Matrix<floatPrec, 4,4> transU, transU_B;
	transU.setIdentity(4,4);
	transU.topRightCorner(3, 1) = -P1_pi.head(3);
	transU_B.setIdentity(4,4);
	transU_B.topRightCorner(3, 1) = -P1_pi_B.head(3);

	// transform P2 and P2_B to the new frame
	Matrix<floatPrec, 4,1> Pi_1, Pi_B1;
	Pi_1 = transU.transpose().inverse() * Pi;
	Pi_B1 = transU_B.transpose().inverse() * Pi_B;

	// aling planes Pi and Pi_B with XY planes of both frames
	Matrix<floatPrec, 4,4> transV, transV_B;
	transV.setIdentity(4,4);
	transV_B.setIdentity(4,4);

	// compute rotation ref A
	Matrix<floatPrec, 3,1> v3, v1, v1_, t1, t2;
	t1.setZero();
	t1(0) = 1;
	t2.setZero();
	t2(1) = 1;
	v3 = Pi_1.head(3).normalized();
	v1 = t1.cross(v3);
	v1_ = t2.cross(v3);
	if (v1.norm() >= v1_.norm())
	{
		v1 = v1.normalized();
	}
	else
	{
		v1 = v1_.normalized();
	}
	transV.topLeftCorner(1, 3) = v1.transpose();
	transV.block(1, 0, 1, 3) = v3.cross(v1).transpose();
	transV.block(2, 0, 1, 3) = v3.transpose();

	// compute rotation ref B
	v3 = Pi_B1.head(3).normalized();
	v1 = t1.cross(v3);
	v1_ = t2.cross(v3);
	if (v1.norm() >= v1_.norm())
	{
		v1 = v1.normalized();
	}
	else
	{
		v1 = v1_.normalized();
	}
	transV_B.topLeftCorner(1, 3) = v1.transpose();
	transV_B.block(1, 0, 1, 3) = v3.cross(v1).transpose();
	transV_B.block(2, 0, 1, 3) = v3.transpose();

	vector<Matrix<floatPrec, 4,4>> out;
	Matrix<floatPrec, 4,4> TP, TP_B;
	TP = transV * transU;
	out.push_back(TP);

	TP_B = transV_B * transU_B;
	out.push_back(TP_B);

	return out;
}